

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinB88>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,host_buffer_type eps)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)N;
  if (N < 1) {
    uVar1 = uVar2;
  }
  pdVar3 = sigma + 2;
  for (; uVar1 * 8 != uVar2; uVar2 = uVar2 + 8) {
    gga_screening_interface<ExchCXX::BuiltinB88>::eval_exc_polar
              (*(double *)((long)rho + uVar2 * 2),*(double *)((long)rho + uVar2 * 2 + 8),pdVar3[-2],
               pdVar3[-1],*pdVar3,(double *)((long)eps + uVar2));
    pdVar3 = pdVar3 + 3;
  }
  return;
}

Assistant:

GGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;


    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], eps[i] );

  }

}